

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O2

void __thiscall raspicam::_private::Private_Impl_Still::commitParameters(Private_Impl_Still *this)

{
  MMAL_PORT_T *port;
  MMAL_STATUS_T MVar1;
  MMAL_FOURCC_T MVar2;
  ostream *poVar3;
  Private_Impl_Still *this_00;
  MMAL_PARAMETER_COLOURFX_T colfx;
  MMAL_PARAMETER_INPUT_CROP_T crop;
  MMAL_PARAMETER_HEADER_T local_40;
  undefined8 local_38;
  undefined4 local_30;
  MMAL_PARAMETER_HEADER_T local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  if (this->changedSettings == true) {
    commitSharpness(this);
    commitContrast(this);
    commitBrightness(this);
    commitQuality(this);
    commitSaturation(this);
    commitISO(this);
    commitExposure(this);
    commitMetering(this);
    commitAWB(this);
    commitImageEffect(this);
    commitRotation(this);
    commitFlips(this);
    MVar1 = mmal_port_parameter_set_boolean(this->camera->control,0x1001d,0);
    if (MVar1 != MMAL_SUCCESS) {
      poVar3 = std::operator<<((ostream *)&std::cout,this->API_NAME);
      std::operator<<(poVar3,": Failed to set video stabilization parameter.\n");
    }
    MVar1 = mmal_port_parameter_set_int32(this->camera->control,0x1000d,0);
    if (MVar1 != MMAL_SUCCESS) {
      poVar3 = std::operator<<((ostream *)&std::cout,this->API_NAME);
      std::operator<<(poVar3,": Failed to set exposure compensation parameter.\n");
    }
    local_40.id = 0x10007;
    local_40.size = 0x14;
    local_38 = 0x8000000000;
    local_30 = 0x80;
    MVar1 = mmal_port_parameter_set(this->camera->control,&local_40);
    if (MVar1 != MMAL_SUCCESS) {
      poVar3 = std::operator<<((ostream *)&std::cout,this->API_NAME);
      std::operator<<(poVar3,": Failed to set color effects parameter.\n");
    }
    local_28.id = 0x10025;
    local_28.size = 0x18;
    local_20 = 0;
    uStack_18 = 0x1000000010000;
    this_00 = (Private_Impl_Still *)this->camera->control;
    MVar1 = mmal_port_parameter_set((MMAL_PORT_T *)this_00,&local_28);
    if (MVar1 != MMAL_SUCCESS) {
      this_00 = (Private_Impl_Still *)std::operator<<((ostream *)&std::cout,this->API_NAME);
      std::operator<<((ostream *)this_00,": Failed to set ROI parameter.\n");
    }
    port = this->encoder_output_port;
    if (port != (MMAL_PORT_T *)0x0) {
      MVar2 = convertEncoding(this_00,this->encoding);
      port->format->encoding = MVar2;
      mmal_port_format_commit(port);
    }
    this->changedSettings = false;
  }
  return;
}

Assistant:

void Private_Impl_Still::commitParameters() {
            if ( !changedSettings ) return;
            commitSharpness();
            commitContrast();
            commitBrightness();
            commitQuality();
            commitSaturation();
            commitISO();
            commitExposure();
            commitMetering();
            commitAWB();
            commitImageEffect();
            commitRotation();
            commitFlips();
            // Set Video Stabilization
            if ( mmal_port_parameter_set_boolean ( camera->control, MMAL_PARAMETER_VIDEO_STABILISATION, 0 ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set video stabilization parameter.\n";
            // Set Exposure Compensation
            if ( mmal_port_parameter_set_int32 ( camera->control, MMAL_PARAMETER_EXPOSURE_COMP , 0 ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set exposure compensation parameter.\n";
            // Set Color Efects
            MMAL_PARAMETER_COLOURFX_T colfx = {{MMAL_PARAMETER_COLOUR_EFFECT,sizeof ( colfx ) }, 0, 0, 0};
            colfx.enable = 0;
            colfx.u = 128;
            colfx.v = 128;
            if ( mmal_port_parameter_set ( camera->control, &colfx.hdr ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set color effects parameter.\n";
            // Set ROI
            MMAL_PARAMETER_INPUT_CROP_T crop = {{MMAL_PARAMETER_INPUT_CROP, sizeof ( MMAL_PARAMETER_INPUT_CROP_T ) }};
            crop.rect.x = ( 65536 * 0 );
            crop.rect.y = ( 65536 * 0 );
            crop.rect.width = ( 65536 * 1 );
            crop.rect.height = ( 65536 * 1 );
            if ( mmal_port_parameter_set ( camera->control, &crop.hdr ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set ROI parameter.\n";
            // Set encoder encoding
            if ( encoder_output_port != NULL ) {
                encoder_output_port->format->encoding = convertEncoding ( encoding );
                mmal_port_format_commit ( encoder_output_port );
            }
            changedSettings = false;
        }